

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_quass.cpp
# Opt level: O0

QpAsmStatus
solveqp(Instance *instance,Settings *settings,Statistics *stats,HighsModelStatus *highs_model_status
       ,HighsBasis *highs_basis,HighsSolution *highs_solution,HighsTimer *qp_timer)

{
  double dVar1;
  QpAsmStatus QVar2;
  reference pvVar3;
  reference pvVar4;
  HighsTimer *in_RCX;
  QpHotstartInformation *in_RDX;
  QpModelStatus *in_RSI;
  Statistics *in_RDI;
  QpSolution *in_R9;
  Instance *unaff_retaddr;
  QpHotstartInformation startinfo;
  HighsInt index;
  HighsInt i;
  QpSolution qp_solution;
  QpModelStatus qp_model_status;
  QpSolution *in_stack_00001368;
  QpModelStatus *in_stack_00001370;
  Statistics *in_stack_00001378;
  QpHotstartInformation *in_stack_00001380;
  Settings *in_stack_00001388;
  Instance *in_stack_00001390;
  HighsTimer *in_stack_000013a0;
  HighsModelStatus *in_stack_00005b88;
  QpHotstartInformation *in_stack_00005b90;
  QpModelStatus *in_stack_00005b98;
  Statistics *in_stack_00005ba0;
  Settings *in_stack_00005ba8;
  Instance *in_stack_00005bb0;
  HighsBasis *in_stack_00005bd0;
  HighsSolution *in_stack_00005bd8;
  HighsTimer *in_stack_00005be0;
  HighsInt in_stack_fffffffffffffdd8;
  int in_stack_fffffffffffffddc;
  undefined4 in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde4;
  HighsModelStatus *in_stack_fffffffffffffdf0;
  QpSolution *in_stack_fffffffffffffdf8;
  QpModelStatus *in_stack_fffffffffffffe00;
  Instance *in_stack_fffffffffffffe08;
  QpSolution *in_stack_fffffffffffffe10;
  Instance *in_stack_fffffffffffffe18;
  HighsBasis *in_stack_fffffffffffffe30;
  HighsSolution *in_stack_fffffffffffffe38;
  int local_158;
  int local_154;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  QpSolution::QpSolution(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  for (local_154 = 0; local_154 < in_RDI->num_iterations; local_154 = local_154 + 1) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)
                        &(in_RDI->density_nullspace).
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish,(long)local_154);
    local_158 = *pvVar3;
    while (in_stack_fffffffffffffddc = local_158,
          pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)
                              &(in_RDI->density_nullspace).
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_finish,(long)(local_154 + 1)),
          in_stack_fffffffffffffddc < *pvVar3) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)
                          &(in_RDI->density_factor).
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish,(long)local_158);
      if (*pvVar3 == local_154) {
        dVar1 = *(double *)(in_RSI + 0x14);
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)&in_RDI[1].time_start,
                            (long)local_158);
        *pvVar4 = dVar1 + *pvVar4;
      }
      local_158 = local_158 + 1;
    }
  }
  QpHotstartInformation::QpHotstartInformation
            ((QpHotstartInformation *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
             in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8);
  if (((int)(in_RDI->time_start).__d.__r == 0) && (in_RDI->num_iterations < 0x3a99)) {
    computeStartingPointBounded
              (unaff_retaddr,
               (Settings *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
               in_RSI,in_RDX,in_RCX);
    solveqp_actual(in_stack_00001390,in_stack_00001388,in_stack_00001380,in_stack_00001378,
                   in_stack_00001370,in_stack_00001368,in_stack_000013a0);
    QVar2 = quass2highs(in_stack_fffffffffffffe18,(Settings *)in_stack_fffffffffffffe10,
                        (Statistics *)in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
                        in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
                        in_stack_fffffffffffffe30,in_stack_fffffffffffffe38);
  }
  else {
    computeStartingPointHighs
              (in_stack_00005bb0,in_stack_00005ba8,in_stack_00005ba0,in_stack_00005b98,
               in_stack_00005b90,in_stack_00005b88,in_stack_00005bd0,in_stack_00005bd8,
               in_stack_00005be0);
    QVar2 = quass2highs(in_stack_fffffffffffffe18,(Settings *)in_stack_fffffffffffffe10,
                        (Statistics *)in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
                        in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
                        in_stack_fffffffffffffe30,in_stack_fffffffffffffe38);
  }
  QpHotstartInformation::~QpHotstartInformation((QpHotstartInformation *)in_R9);
  QpSolution::~QpSolution(in_R9);
  return QVar2;
}

Assistant:

QpAsmStatus solveqp(Instance& instance, Settings& settings, Statistics& stats,
                    HighsModelStatus& highs_model_status,
                    HighsBasis& highs_basis, HighsSolution& highs_solution,
                    HighsTimer& qp_timer) {
  QpModelStatus qp_model_status = QpModelStatus::kUndetermined;

  QpSolution qp_solution(instance);

  // presolve

  // scale instance, store scaling factors

  // perturb instance, store perturbance information

  // regularize
  for (HighsInt i = 0; i < instance.num_var; i++) {
    for (HighsInt index = instance.Q.mat.start[i];
         index < instance.Q.mat.start[i + 1]; index++) {
      if (instance.Q.mat.index[index] == i) {
        instance.Q.mat.value[index] += settings.hessianregularizationfactor;
      }
    }
  }

  // compute initial feasible point
  QpHotstartInformation startinfo(instance.num_var, instance.num_con);
  if (instance.num_con == 0 && instance.num_var <= 15000) {
    computeStartingPointBounded(instance, settings, stats, qp_model_status,
                                startinfo, qp_timer);
    if (qp_model_status == QpModelStatus::kOptimal) {
      qp_solution.primal = startinfo.primal;
      return quass2highs(instance, settings, stats, qp_model_status,
                         qp_solution, highs_model_status, highs_basis,
                         highs_solution);
    }
    if (qp_model_status == QpModelStatus::kUnbounded) {
      return quass2highs(instance, settings, stats, qp_model_status,
                         qp_solution, highs_model_status, highs_basis,
                         highs_solution);
    }
  } else {
    computeStartingPointHighs(instance, settings, stats, qp_model_status,
                              startinfo, highs_model_status, highs_basis,
                              highs_solution, qp_timer);
    if (qp_model_status != QpModelStatus::kNotset) {
      return quass2highs(instance, settings, stats, qp_model_status,
                         qp_solution, highs_model_status, highs_basis,
                         highs_solution);
    }
  }

  // solve
  solveqp_actual(instance, settings, startinfo, stats, qp_model_status,
                 qp_solution, qp_timer);

  // undo perturbation and resolve

  // undo scaling and resolve

  // postsolve

  // Transform QP status and qp_solution to HiGHS highs_basis and highs_solution
  return quass2highs(instance, settings, stats, qp_model_status, qp_solution,
                     highs_model_status, highs_basis, highs_solution);
}